

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_decoder.h
# Opt level: O0

bool __thiscall
draco::DirectBitDecoder::DecodeLeastSignificantBits32
          (DirectBitDecoder *this,int nbits,uint32_t *value)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference puVar4;
  uint *in_RDX;
  int in_ESI;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RDI;
  uint32_t value_r;
  uint32_t value_l;
  int remaining;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  iVar2 = 0x20 - *(int *)&in_RDI[4]._M_current;
  if (iVar2 < in_ESI) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator+((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                (difference_type)in_RDI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator==
                      (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (bVar1) {
      return false;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(in_RDI + 3);
    uVar3 = *puVar4 << ((byte)*(undefined4 *)&in_RDI[4]._M_current & 0x1f);
    *(int *)&in_RDI[4]._M_current = in_ESI - iVar2;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(in_RDI + 3);
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(in_RDI + 3);
    *in_RDX = uVar3 >> ((' ' - (char)*(undefined4 *)&in_RDI[4]._M_current) - (char)iVar2 & 0x1fU) |
              *puVar4 >> (0x20U - (char)*(undefined4 *)&in_RDI[4]._M_current & 0x1f);
  }
  else {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    bVar1 = __gnu_cxx::operator==
                      (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)this_00);
    if (bVar1) {
      return false;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(in_RDI + 3);
    *in_RDX = (*puVar4 << ((byte)*(undefined4 *)&in_RDI[4]._M_current & 0x1f)) >>
              (0x20U - (char)in_ESI & 0x1f);
    *(int *)&in_RDI[4]._M_current = in_ESI + *(int *)&in_RDI[4]._M_current;
    if (*(int *)&in_RDI[4]._M_current == 0x20) {
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(in_RDI + 3);
      *(undefined4 *)&in_RDI[4]._M_current = 0;
    }
  }
  return true;
}

Assistant:

bool DecodeLeastSignificantBits32(int nbits, uint32_t *value) {
    DRACO_DCHECK_EQ(true, nbits <= 32);
    DRACO_DCHECK_EQ(true, nbits > 0);
    const int remaining = 32 - num_used_bits_;
    if (nbits <= remaining) {
      if (pos_ == bits_.end()) {
        return false;
      }
      *value = (*pos_ << num_used_bits_) >> (32 - nbits);
      num_used_bits_ += nbits;
      if (num_used_bits_ == 32) {
        ++pos_;
        num_used_bits_ = 0;
      }
    } else {
      if (pos_ + 1 == bits_.end()) {
        return false;
      }
      const uint32_t value_l = ((*pos_) << num_used_bits_);
      num_used_bits_ = nbits - remaining;
      ++pos_;
      const uint32_t value_r = (*pos_) >> (32 - num_used_bits_);
      *value = (value_l >> (32 - num_used_bits_ - remaining)) | value_r;
    }
    return true;
  }